

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_ManAddCube1(int nRowLimit,word *Cover,int nRows,word Cube)

{
  ulong *puVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (nRowLimit < nRows) {
    __assert_fail("nRows <= nRowLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                  ,0x353,"int Sbd_ManAddCube1(int, word *, int, word)");
  }
  uVar5 = 0;
  if (0 < nRows) {
    uVar5 = (ulong)(uint)nRows;
  }
  uVar6 = 0;
  do {
    if (uVar5 == uVar6) {
      iVar2 = 0;
      for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
        if ((Cube & ~Cover[uVar6]) != 0) {
          Cover[iVar2] = Cover[uVar6];
          iVar2 = iVar2 + 1;
        }
      }
      iVar3 = iVar2;
      if (iVar2 < nRowLimit) {
        iVar3 = iVar2 + 1;
        Cover[iVar2] = Cube;
      }
      for (lVar4 = (long)iVar3; lVar4 < nRows; lVar4 = lVar4 + 1) {
        Cover[lVar4] = 0;
      }
      return iVar3;
    }
    puVar1 = Cover + uVar6;
    uVar6 = uVar6 + 1;
  } while ((*puVar1 & ~Cube) != 0);
  return nRows;
}

Assistant:

static inline int Sbd_ManAddCube1( int nRowLimit, word Cover[], int nRows, word Cube )
{
    int n, m;
    if ( 0 )
    {
        printf( "Adding cube: " );
        for ( n = 0; n < nRowLimit; n++ )
            printf( "%d", (int)((Cube >> n) & 1) );
        printf( "\n" );
    }
    // do not add contained Cube
    assert( nRows <= nRowLimit );
    for ( n = 0; n < nRows; n++ )
        if ( (Cover[n] & Cube) == Cover[n] ) // Cube is contained
            return nRows;
    // remove rows contained by Cube
    for ( n = m = 0; n < nRows; n++ )
        if ( (Cover[n] & Cube) != Cube ) // Cover[n] is not contained
            Cover[m++] = Cover[n];
    if ( m < nRowLimit )
        Cover[m++] = Cube;
    for ( n = m; n < nRows; n++ )
        Cover[n] = 0;
    nRows = m;
    return nRows;
}